

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kops.c
# Opt level: O2

void m68k_op_moves_32_pd(void)

{
  uint uVar1;
  uint uVar2;
  
  if (((ushort)m68ki_cpu.cpu_type & 0x3fc) == 0) {
    m68ki_exception_illegal();
    return;
  }
  if (m68ki_cpu.s_flag != 0) {
    uVar1 = m68ki_read_imm_16();
    uVar2 = m68ki_cpu.dar[(ulong)(m68ki_cpu.ir & 7) + 8] - 4;
    m68ki_cpu.dar[(ulong)(m68ki_cpu.ir & 7) + 8] = uVar2;
    if ((uVar1 >> 0xb & 1) == 0) {
      uVar2 = m68ki_read_32_fc(uVar2,m68ki_cpu.sfc);
      *(uint *)((long)m68ki_cpu.dar + (ulong)(uVar1 >> 10 & 0x3c)) = uVar2;
    }
    else {
      m68ki_write_32_fc(uVar2,m68ki_cpu.dfc,
                        *(uint *)((long)m68ki_cpu.dar + (ulong)(uVar1 >> 10 & 0x3c)));
    }
    if (((ushort)m68ki_cpu.cpu_type & 0x18) != 0) {
      m68ki_remaining_cycles = m68ki_remaining_cycles + -2;
    }
    return;
  }
  m68ki_exception_privilege_violation();
  return;
}

Assistant:

static void m68k_op_moves_32_pd(void)
{
	if(CPU_TYPE_IS_010_PLUS(CPU_TYPE))
	{
		if(FLAG_S)
		{
			uint word2 = OPER_I_16();
			uint ea = EA_AY_PD_32();

			m68ki_trace_t0();			   /* auto-disable (see m68kcpu.h) */
			if(BIT_B(word2))		   /* Register to memory */
			{
				m68ki_write_32_fc(ea, REG_DFC, REG_DA[(word2 >> 12) & 15]);
				if(CPU_TYPE_IS_020_VARIANT(CPU_TYPE))
					USE_CYCLES(2);
				return;
			}
			/* Memory to register */
			REG_DA[(word2 >> 12) & 15] = m68ki_read_32_fc(ea, REG_SFC);
			if(CPU_TYPE_IS_020_VARIANT(CPU_TYPE))
				USE_CYCLES(2);
			return;
		}
		m68ki_exception_privilege_violation();
		return;
	}
	m68ki_exception_illegal();
}